

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QList<MakefileGenerator::SubTarget_*> * __thiscall
MakefileGenerator::findSubDirsSubTargets
          (QList<MakefileGenerator::SubTarget_*> *__return_storage_ptr__,MakefileGenerator *this)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  SourceFiles *pSVar3;
  QString string;
  QString file;
  QString string_00;
  int *piVar4;
  Data *pDVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  char cVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  ProStringList *pPVar19;
  QString *pQVar20;
  ProStringList *pPVar21;
  QList<ProString> *this_00;
  QString *pQVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  MakefileGenerator *pMVar26;
  longlong lVar27;
  QArrayData *pQVar28;
  ulong uVar29;
  SourceFiles *pSVar30;
  long in_FS_OFFSET;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QAnyStringView QVar34;
  QStringView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QStringView QVar44;
  QStringView config;
  ProKey dskey;
  ProKey dfkey;
  ProKey tkey;
  ProKey dkey;
  ProKey mkey;
  ProKey skey;
  ProKey fkey;
  ProString ofile;
  undefined8 in_stack_fffffffffffffcc8;
  QString *pQVar45;
  QArrayData *local_308;
  QRegularExpression local_300 [8];
  QStringBuilder<const_char_(&)[5],_QString_&> local_2f8;
  ProString local_2e8;
  QString local_2b8;
  undefined1 local_298 [32];
  undefined1 *local_278;
  undefined1 *puStack_270;
  QString local_268;
  undefined1 local_248 [32];
  undefined1 *local_228;
  undefined1 *puStack_220;
  undefined1 local_218 [32];
  undefined1 *local_1f8;
  undefined1 *puStack_1f0;
  QArrayData *local_1e8;
  QString *pQStack_1e0;
  undefined1 *local_1d8;
  QString local_1c8;
  undefined1 local_1a8 [32];
  undefined1 *local_188;
  undefined1 *puStack_180;
  QArrayData *local_170;
  char16_t *local_168;
  qsizetype local_160;
  QString local_158;
  undefined1 local_138 [32];
  Data *local_118;
  QMakeLocalFileName *pQStack_110;
  undefined1 local_108 [32];
  char *local_e8;
  undefined1 *puStack_e0;
  undefined1 local_d8 [32];
  QHash<QString,_bool> local_b8;
  Data *pDStack_b0;
  QArrayData *local_a8;
  Data *pDStack_a0;
  Data *local_98;
  QString local_88;
  undefined1 local_68 [32];
  Data *local_48;
  QMakeLocalFileName *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (SubTarget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_68,"SUBDIRS");
  pPVar19 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  piVar4 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
    }
  }
  if ((pPVar19->super_QList<ProString>).d.size != 0) {
    uVar24 = 0;
    do {
      local_48 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QMakeLocalFileName *)&DAT_aaaaaaaaaaaaaaaa;
      local_68._16_4_ = 0xaaaaaaaa;
      local_68._20_4_ = 0xaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_4_ = 0xaaaaaaaa;
      local_68._4_4_ = 0xaaaaaaaa;
      local_68._8_4_ = 0xaaaaaaaa;
      local_68._12_4_ = 0xaaaaaaaa;
      ProString::ProString((ProString *)local_68,(pPVar19->super_QList<ProString>).d.ptr + uVar24);
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString(&local_88,(ProString *)local_68);
      local_a8 = &(local_88.d.d)->super_QArrayData;
      pDStack_a0 = (Data *)local_88.d.ptr;
      local_98 = (Data *)local_88.d.size;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar31.m_data = (storage_type *)0xd;
      QVar31.m_size = (qsizetype)local_d8;
      QString::fromUtf8(QVar31);
      local_108._0_8_ = local_d8._0_8_;
      local_108._8_8_ = local_d8._8_8_;
      local_108._16_8_ = local_d8._16_8_;
      QRegularExpression::QRegularExpression((QRegularExpression *)local_1a8,local_108,0);
      QVar32.m_data = (storage_type *)0x1;
      QVar32.m_size = (qsizetype)local_d8;
      QString::fromUtf8(QVar32);
      local_138._0_8_ = local_d8._0_8_;
      local_138._8_8_ = local_d8._8_8_;
      local_138._16_8_ = local_d8._16_8_;
      QString::replace((QRegularExpression *)&local_a8,(QString *)local_1a8);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      QRegularExpression::~QRegularExpression((QRegularExpression *)local_1a8);
      if ((QArrayData *)local_108._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
      pQVar20 = (QString *)operator_new(0xa8);
      memset(pQVar20,0,0xa8);
      QString::operator=(pQVar20,(QString *)&local_88);
      local_d8._0_8_ = pQVar20;
      QtPrivate::QPodArrayOps<MakefileGenerator::SubTarget*>::
      emplace<MakefileGenerator::SubTarget*&>
                ((QPodArrayOps<MakefileGenerator::SubTarget*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(SubTarget **)local_d8);
      QList<MakefileGenerator::SubTarget_*>::end(__return_storage_ptr__);
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pDStack_b0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = ".file";
      local_108._0_8_ = (QArrayData *)&local_a8;
      ProString::ProString<QString&,char_const(&)[6]>
                ((ProString *)local_d8,(QStringBuilder<QString_&,_const_char_(&)[6]> *)local_108);
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_108._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_138._8_8_ = ".subdir";
      local_138._0_8_ = (QArrayData *)&local_a8;
      ProString::ProString<QString&,char_const(&)[8]>
                ((ProString *)local_108,(QStringBuilder<QString_&,_const_char_(&)[8]> *)local_138);
      pMVar26 = this;
      bVar13 = QMakeProject::isEmpty(this->project,(ProKey *)local_d8);
      bVar14 = QMakeProject::isEmpty(this->project,(ProKey *)local_108);
      if (bVar13) {
        if (bVar14) {
          bVar13 = ProString::endsWith((ProString *)local_68,&Option::pro_ext,CaseSensitive);
          this = pMVar26;
        }
        else {
          QMakeEvaluator::first
                    ((ProString *)local_138,&pMVar26->project->super_QMakeEvaluator,
                     (ProKey *)local_108);
          QString::operator=((QString *)local_68,(QString *)local_138);
          uVar9 = local_138._0_8_;
          pQStack_40 = pQStack_110;
          local_68._24_8_ = local_138._24_8_;
          local_48 = local_118;
          if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
            }
          }
          bVar13 = false;
          this = pMVar26;
        }
      }
      else {
        this = pMVar26;
        if (!bVar14) {
          ProString::toLatin1((QByteArray *)local_138,
                              (pPVar19->super_QList<ProString>).d.ptr + uVar24);
          pSVar30 = (SourceFiles *)local_138._8_8_;
          if ((SourceFiles *)local_138._8_8_ == (SourceFiles *)0x0) {
            pSVar30 = (SourceFiles *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Cannot assign both file and subdir for subdir %s",pSVar30);
          uVar9 = local_138._0_8_;
          if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_138._0_8_,1,0x10);
            }
          }
        }
        QMakeEvaluator::first
                  ((ProString *)local_138,&pMVar26->project->super_QMakeEvaluator,(ProKey *)local_d8
                  );
        QString::operator=((QString *)local_68,(QString *)local_138);
        pQStack_40 = pQStack_110;
        local_68._24_8_ = local_138._24_8_;
        local_48 = local_118;
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
          }
        }
        bVar13 = true;
      }
      local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)local_1a8,(ProString *)local_68);
      local_138._0_8_ = local_1a8._0_8_;
      local_138._8_8_ = local_1a8._8_8_;
      local_138._16_8_ = local_1a8._16_8_;
      if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string.d.ptr = (char16_t *)pQVar20;
      string.d.d = (Data *)in_stack_fffffffffffffcc8;
      string.d.size = (qsizetype)this;
      Option::fixString(&local_158,string,(uchar)(QArrayData *)local_138);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
        }
      }
      qVar6 = local_158.d.size;
      if (bVar13 == false) {
        if ((SourceFiles *)local_158.d.size == (SourceFiles *)0x0) {
          bVar13 = false;
        }
        else {
          pQVar1 = this->project;
          QVar33.m_data = (storage_type *)0x10;
          QVar33.m_size = (qsizetype)local_138;
          QString::fromUtf8(QVar33);
          local_308 = (QArrayData *)local_138._0_8_;
          config.m_data = (storage_type_conflict *)local_138._8_8_;
          config.m_size = local_138._16_8_;
          bVar13 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
          bVar13 = !bVar13;
        }
        if (local_308 != (QArrayData *)0x0 && (SourceFiles *)qVar6 != (SourceFiles *)0x0) {
          LOCK();
          (local_308->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_308->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_308->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_308,2,0x10);
          }
        }
        if (!bVar13) {
LAB_00178c1d:
          pQVar22 = pQVar20;
          QString::operator=(pQVar20 + 1,(QString *)&local_158);
          goto LAB_00178c34;
        }
        local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QString::section((QArrayData *)local_138,&local_158,&Option::dir_sep,0xffffffffffffffff,
                         0xffffffffffffffff,0);
        uVar9 = local_138._16_8_;
        if ((SourceFiles *)local_138._16_8_ == (SourceFiles *)0x0) {
          ProString::toLatin1((QByteArray *)local_1a8,
                              (pPVar19->super_QList<ProString>).d.ptr + uVar24);
          pSVar30 = (SourceFiles *)local_1a8._8_8_;
          if ((SourceFiles *)local_1a8._8_8_ == (SourceFiles *)0x0) {
            pSVar30 = (SourceFiles *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Ignoring invalid SUBDIRS entry %s",pSVar30);
          if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0)
            {
              lVar27 = 1;
              goto LAB_00178bcb;
            }
          }
        }
        else {
          local_218._8_8_ = &Option::pro_ext;
          local_218._0_8_ = (QArrayData *)local_138;
          QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                    ((QString *)local_1a8,(QStringBuilder<const_QString_&,_QString_&> *)local_218);
          pQVar28 = &(pQVar20[3].d.d)->super_QArrayData;
          pSVar30 = (SourceFiles *)pQVar20[3].d.ptr;
          pQVar20[3].d.d = (Data *)local_1a8._0_8_;
          pQVar20[3].d.ptr = (char16_t *)local_1a8._8_8_;
          pSVar3 = (SourceFiles *)pQVar20[3].d.size;
          pQVar20[3].d.size = local_1a8._16_8_;
          local_1a8._0_8_ = pQVar28;
          local_1a8._8_8_ = pSVar30;
          local_1a8._16_8_ = pSVar3;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&pQVar28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQVar28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QArrayData *)&pQVar28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0)
            {
              lVar27 = 2;
LAB_00178bcb:
              QArrayData::deallocate((QArrayData *)local_1a8._0_8_,lVar27,0x10);
            }
          }
        }
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
          }
        }
        if ((SourceFiles *)uVar9 != (SourceFiles *)0x0) goto LAB_00178c1d;
      }
      else {
        uVar17 = QString::lastIndexOf
                           ((QString *)&local_158,0x2e2bf0,(CaseSensitivity)local_158.d.size);
        pQVar22 = pQVar20;
        if (uVar17 == 0xffffffff) {
          QString::operator=(pQVar20 + 3,(QString *)&local_158);
        }
        else {
          pSVar30 = (SourceFiles *)((long)(((ulong)uVar17 << 0x20) + 0x100000000) >> 0x20);
          if (pSVar30 < (ulong)local_158.d.size) {
            QString::QString((QString *)local_138,(QChar *)local_158.d.ptr,(longlong)pSVar30);
          }
          else {
            local_138._0_8_ = local_158.d.d;
            local_138._8_8_ = local_158.d.ptr;
            local_138._16_8_ = local_158.d.size;
            if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          pQVar28 = &(pQVar20[1].d.d)->super_QArrayData;
          pSVar30 = (SourceFiles *)pQVar20[1].d.ptr;
          pQVar20[1].d.d = (Data *)local_138._0_8_;
          pQVar20[1].d.ptr = (char16_t *)local_138._8_8_;
          pSVar3 = (SourceFiles *)pQVar20[1].d.size;
          pQVar20[1].d.size = local_138._16_8_;
          local_138._0_8_ = pQVar28;
          local_138._8_8_ = pSVar30;
          local_138._16_8_ = pSVar3;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar28,2,0x10);
            }
          }
          QString::mid((longlong)local_138,(longlong)&local_158);
          pQVar28 = &(pQVar20[3].d.d)->super_QArrayData;
          pSVar30 = (SourceFiles *)pQVar20[3].d.ptr;
          pQVar20[3].d.d = (Data *)local_138._0_8_;
          pQVar20[3].d.ptr = (char16_t *)local_138._8_8_;
          pSVar3 = (SourceFiles *)pQVar20[3].d.size;
          pQVar20[3].d.size = local_138._16_8_;
          local_138._0_8_ = pQVar28;
          local_138._8_8_ = pSVar30;
          local_138._16_8_ = pSVar3;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar28,2,0x10);
            }
          }
        }
LAB_00178c34:
        pQVar45 = pQVar20 + 1;
        pMVar26 = this;
        while (cVar15 = QString::endsWith((QString *)pQVar45,0x2e2bf0), cVar15 != '\0') {
          QString::chop((longlong)pQVar45);
        }
        local_170 = &(pQVar20[1].d.d)->super_QArrayData;
        local_168 = pQVar20[1].d.ptr;
        local_160 = pQVar20[1].d.size;
        if (local_170 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&local_170->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&local_170->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        file.d.ptr = (char16_t *)pQVar22;
        file.d.d = (Data *)in_stack_fffffffffffffcc8;
        file.d.size = (qsizetype)pMVar26;
        fileInfo((MakefileGenerator *)local_138,file);
        cVar15 = QFileInfo::isRelative();
        QFileInfo::~QFileInfo((QFileInfo *)local_138);
        if (local_170 != (QArrayData *)0x0) {
          LOCK();
          (local_170->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_170->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_170->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_170,2,0x10);
          }
        }
        if (cVar15 == '\0') {
          fileFixify((QString *)local_138,pMVar26,pQVar45,(FileFixifyTypes)0x3,true);
          pQVar28 = &(pQVar22[2].d.d)->super_QArrayData;
          pSVar30 = (SourceFiles *)pQVar22[2].d.ptr;
          pQVar22[2].d.d = (Data *)local_138._0_8_;
          pQVar22[2].d.ptr = (char16_t *)local_138._8_8_;
          pSVar3 = (SourceFiles *)pQVar22[2].d.size;
          pQVar22[2].d.size = local_138._16_8_;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              local_138._0_8_ = pQVar28;
              local_138._8_8_ = pSVar30;
              local_138._16_8_ = pSVar3;
              QArrayData::deallocate(pQVar28,2,0x10);
            }
          }
        }
        else {
          QString::operator=(pQVar22 + 2,(QString *)pQVar45);
        }
        local_118 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_110 = (QMakeLocalFileName *)&DAT_aaaaaaaaaaaaaaaa;
        local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = &local_a8;
        local_1a8._8_8_ = ".makefile";
        ProString::ProString<QString&,char_const(&)[10]>
                  ((ProString *)local_138,(QStringBuilder<QString_&,_const_char_(&)[10]> *)local_1a8
                  );
        this = pMVar26;
        bVar13 = QMakeProject::isEmpty(pMVar26->project,(ProKey *)local_138);
        if (bVar13) {
          QVar34.m_size = (size_t)"Makefile";
          QVar34.field_0.m_data = pQVar22 + 5;
          pQVar20 = pQVar22;
          QString::assign(QVar34);
          if (pQVar22[3].d.size != 0) {
            local_218._0_8_ = pQVar20[1].d.d;
            local_218._8_8_ = pQVar20[1].d.ptr;
            local_218._16_8_ = pQVar20[1].d.size;
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)local_218._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_218._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            pQVar45 = pQVar20;
            iVar18 = QString::lastIndexOf
                               ((QString *)local_218,0x2e2bf0,(CaseSensitivity)local_218._16_8_);
            if (iVar18 != -1) {
              QString::mid((longlong)local_1a8,(longlong)local_218);
              uVar12 = local_1a8._16_8_;
              uVar11 = local_1a8._0_8_;
              uVar10 = local_218._8_8_;
              uVar9 = local_218._0_8_;
              local_1a8._0_8_ = local_218._0_8_;
              local_218._0_8_ = uVar11;
              local_218._8_8_ = local_1a8._8_8_;
              local_1a8._8_8_ = uVar10;
              local_1a8._16_8_ = local_218._16_8_;
              local_218._16_8_ = uVar12;
              if ((QArrayData *)uVar9 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar9,2,0x10);
                }
              }
            }
            local_248._8_8_ = &Option::pro_ext;
            local_248._0_8_ = (QArrayData *)local_218;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      ((QString *)local_1a8,(QStringBuilder<QString_&,_QString_&> *)local_248);
            pSVar30 = (SourceFiles *)pQVar20[3].d.size;
            bVar16 = 1;
            pQVar20 = pQVar45;
            pMVar26 = this;
            if (pSVar30 == (SourceFiles *)local_1a8._16_8_) {
              QVar35.m_data = pQVar45[3].d.ptr;
              QVar35.m_size = (qsizetype)pSVar30;
              QVar44.m_data = (storage_type_conflict *)local_1a8._8_8_;
              QVar44.m_size = local_1a8._16_8_;
              bVar16 = QtPrivate::equalStrings(QVar35,QVar44);
              bVar16 = bVar16 ^ 1;
              pQVar20 = pQVar45;
              pMVar26 = this;
            }
            if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
              }
            }
            this = pMVar26;
            if (bVar16 != 0) {
              QString::left((QString *)local_248,pQVar20 + 3,
                            pQVar20[3].d.size - Option::pro_ext.d.size);
              local_1a8._24_8_ = local_248._16_8_;
              local_1a8._16_8_ = local_248._8_8_;
              local_1a8._8_8_ = local_248._0_8_;
              local_1a8._0_8_ = ".";
              local_248._0_8_ = (QArrayData *)0x0;
              local_248._8_8_ = (SourceFiles *)0x0;
              local_248._16_8_ = (SourceFiles *)0x0;
              ::operator+=(pQVar22 + 5,(QStringBuilder<const_char_(&)[2],_QString> *)local_1a8);
              uVar9 = local_1a8._8_8_;
              if ((QArrayData *)local_1a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_1a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_1a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_1a8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                }
              }
            }
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              iVar18 = (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i;
              UNLOCK();
              pQVar28 = (QArrayData *)local_218._0_8_;
              goto joined_r0x00179146;
            }
          }
        }
        else {
          QMakeEvaluator::first
                    ((ProString *)local_1a8,&pMVar26->project->super_QMakeEvaluator,
                     (ProKey *)local_138);
          ProString::toQString((QString *)local_218,(ProString *)local_1a8);
          pQVar28 = &(pQVar22[5].d.d)->super_QArrayData;
          pQVar2 = (QArrayData *)pQVar22[5].d.ptr;
          pQVar22[5].d.d = (Data *)local_218._0_8_;
          pQVar22[5].d.ptr = (char16_t *)local_218._8_8_;
          pSVar30 = (SourceFiles *)pQVar22[5].d.size;
          pQVar22[5].d.size = local_218._16_8_;
          pQVar20 = pQVar22;
          local_218._0_8_ = pQVar28;
          local_218._8_8_ = pQVar2;
          local_218._16_8_ = pSVar30;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar28,2,0x10);
              pQVar20 = pQVar22;
            }
          }
          if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            iVar18 = (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar28 = (QArrayData *)local_1a8._0_8_;
joined_r0x00179146:
            if (iVar18 == 0) {
              QArrayData::deallocate(pQVar28,2,0x10);
            }
          }
        }
        local_188 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._0_8_ = &local_a8;
        local_218._8_8_ = ".depends";
        ProString::ProString<QString&,char_const(&)[9]>
                  ((ProString *)local_1a8,(QStringBuilder<QString_&,_const_char_(&)[9]> *)local_218)
        ;
        bVar13 = QMakeProject::isEmpty(pMVar26->project,(ProKey *)local_1a8);
        if ((!bVar13) &&
           (pPVar21 = QMakeEvaluator::valuesRef
                                (&pMVar26->project->super_QMakeEvaluator,(ProKey *)local_1a8),
           (pPVar21->super_QList<ProString>).d.size != 0)) {
          this_00 = (QList<ProString> *)(pQVar20 + 6);
          uVar23 = 0;
          do {
            pMVar26 = this;
            if ((pPVar19->super_QList<ProString>).d.size != 0) {
              lVar25 = 0;
              uVar29 = 0;
              do {
                bVar13 = ProString::operator==
                                   ((ProString *)
                                    ((long)&(((pPVar19->super_QList<ProString>).d.ptr)->m_string).d.
                                            d + lVar25),
                                    (pPVar21->super_QList<ProString>).d.ptr + uVar23);
                if (bVar13) {
                  local_1c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_1c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_1c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  ProString::toQString
                            (&local_1c8,
                             (ProString *)
                             ((long)&(((pPVar19->super_QList<ProString>).d.ptr)->m_string).d.d +
                             lVar25));
                  local_1e8 = &(local_1c8.d.d)->super_QArrayData;
                  pQStack_1e0 = (QString *)local_1c8.d.ptr;
                  local_1d8 = (undefined1 *)local_1c8.d.size;
                  if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  QVar38.m_data = (storage_type *)0xd;
                  QVar38.m_size = (qsizetype)local_218;
                  QString::fromUtf8(QVar38);
                  local_248._0_8_ = local_218._0_8_;
                  local_248._8_8_ = local_218._8_8_;
                  local_248._16_8_ = local_218._16_8_;
                  QRegularExpression::QRegularExpression
                            ((QRegularExpression *)&local_2e8,local_248,0);
                  QVar39.m_data = (storage_type *)0x1;
                  QVar39.m_size = (qsizetype)local_218;
                  QString::fromUtf8(QVar39);
                  local_298._0_8_ = local_218._0_8_;
                  local_298._8_8_ = local_218._8_8_;
                  local_298._16_8_ = local_218._16_8_;
                  QString::replace((QRegularExpression *)&local_1e8,(QString *)&local_2e8);
                  pMVar26 = this;
                  if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                    }
                  }
                  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_2e8);
                  if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                    }
                  }
                  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_248._0_8_ = &local_1e8;
                  local_248._8_8_ = ".target";
                  ProString::ProString<QString&,char_const(&)[8]>
                            ((ProString *)local_218,
                             (QStringBuilder<QString_&,_const_char_(&)[8]> *)local_248);
                  bVar13 = QMakeProject::isEmpty(this->project,(ProKey *)local_218);
                  if (bVar13) {
                    local_268.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_268.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_268.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    local_248._0_8_ = local_1c8.d.d;
                    local_248._8_8_ = local_1c8.d.ptr;
                    local_248._16_8_ = local_1c8.d.size;
                    if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    string_00.d.ptr = (char16_t *)pQVar20;
                    string_00.d.d = (Data *)in_stack_fffffffffffffcc8;
                    string_00.d.size = (qsizetype)pMVar26;
                    Option::fixString(&local_268,string_00,(uchar)local_248);
                    if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                      }
                    }
                    local_228 = &DAT_aaaaaaaaaaaaaaaa;
                    puStack_220 = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_298._8_8_ = ".file";
                    local_298._0_8_ = (QArrayData *)&local_1e8;
                    ProString::ProString<QString&,char_const(&)[6]>
                              ((ProString *)local_248,
                               (QStringBuilder<QString_&,_const_char_(&)[6]> *)local_298);
                    bVar13 = QMakeProject::isEmpty(pMVar26->project,(ProKey *)local_248);
                    if (bVar13) {
                      local_278 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_2e8.m_string.d.ptr = L".subdir";
                      local_2e8.m_string.d.d = (Data *)&local_1e8;
                      ProString::ProString<QString&,char_const(&)[8]>
                                ((ProString *)local_298,
                                 (QStringBuilder<QString_&,_const_char_(&)[8]> *)&local_2e8);
                      this = pMVar26;
                      bVar13 = QMakeProject::isEmpty(pMVar26->project,(ProKey *)local_298);
                      if (!bVar13) {
                        QMakeEvaluator::first
                                  (&local_2e8,&pMVar26->project->super_QMakeEvaluator,
                                   (ProKey *)local_298);
                        ProString::toQString(&local_2b8,&local_2e8);
                        pcVar8 = local_268.d.ptr;
                        pDVar7 = local_268.d.d;
                        qVar6 = local_2b8.d.size;
                        pDVar5 = local_2b8.d.d;
                        local_2b8.d.d = local_268.d.d;
                        local_268.d.d = pDVar5;
                        local_268.d.ptr = local_2b8.d.ptr;
                        local_2b8.d.ptr = pcVar8;
                        local_2b8.d.size = local_268.d.size;
                        local_268.d.size = qVar6;
                        if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                               (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                               _M_i + -1;
                          UNLOCK();
                          if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                              == 0) {
                            QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
                          }
                        }
                        goto LAB_00179880;
                      }
                    }
                    else {
                      this = pMVar26;
                      QMakeEvaluator::first
                                ((ProString *)local_298,&pMVar26->project->super_QMakeEvaluator,
                                 (ProKey *)local_248);
                      ProString::toQString(&local_2e8.m_string,(ProString *)local_298);
                      qVar6 = local_2e8.m_string.d.size;
                      pDVar5 = local_2e8.m_string.d.d;
                      local_2e8.m_string.d.d = local_268.d.d;
                      local_268.d.d = pDVar5;
                      pSVar30 = (SourceFiles *)local_2e8.m_string.d.ptr;
                      local_2e8.m_string.d.ptr = local_268.d.ptr;
                      local_2e8.m_string.d.size = local_268.d.size;
                      local_268.d.size = qVar6;
                      local_268.d.ptr = (char16_t *)pSVar30;
LAB_00179880:
                      if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i =
                             ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10)
                          ;
                        }
                      }
                    }
                    if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_298._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                      }
                    }
                    QVar40.m_data = (storage_type *)0xd;
                    QVar40.m_size = (qsizetype)local_298;
                    QString::fromUtf8(QVar40);
                    local_2e8.m_string.d.d = (Data *)local_298._0_8_;
                    local_2e8.m_string.d.ptr = (char16_t *)local_298._8_8_;
                    local_2e8.m_string.d.size = local_298._16_8_;
                    QRegularExpression::QRegularExpression(local_300,&local_2e8,0);
                    QVar41.m_data = (storage_type *)0x1;
                    QVar41.m_size = (qsizetype)local_298;
                    QString::fromUtf8(QVar41);
                    local_2b8.d.d = (Data *)local_298._0_8_;
                    local_2b8.d.ptr = (char16_t *)local_298._8_8_;
                    local_2b8.d.size = local_298._16_8_;
                    local_2f8.b = (QString *)
                                  QString::replace((QRegularExpression *)&local_268,
                                                   (QString *)local_300);
                    local_2f8.a = (char (*) [5])0x2a93e9;
                    ProString::ProString<char_const(&)[5],QString&>
                              ((ProString *)local_298,&local_2f8);
                    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                              ((QMovableArrayOps<ProString> *)this_00,pQVar20[6].d.size,
                               (ProString *)local_298);
                    QList<ProString>::end(this_00);
                    if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_298._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                      }
                    }
                    if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_2b8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QRegularExpression::~QRegularExpression(local_300);
                    if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                           ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                      }
                    }
                    if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_268.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_268.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  else {
                    QMakeEvaluator::first
                              ((ProString *)local_248,&this->project->super_QMakeEvaluator,
                               (ProKey *)local_218);
                    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                              ((QMovableArrayOps<ProString> *)this_00,pQVar20[6].d.size,
                               (ProString *)local_248);
                    QList<ProString>::end(this_00);
                    uVar9 = local_248._0_8_;
                    this = pMVar26;
                    if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      this = pMVar26;
                      if ((((QBasicAtomicInt *)uVar9)->_q_value).super___atomic_base<int>._M_i == 0)
                      {
                        QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                        this = pMVar26;
                      }
                    }
                  }
                  if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
                    }
                  }
                  if (local_1e8 != (QArrayData *)0x0) {
                    LOCK();
                    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_1e8,2,0x10);
                    }
                  }
                  if (&(local_1c8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00179af3;
                  LOCK();
                  ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  pQVar28 = &(local_1c8.d.d)->super_QArrayData;
                  if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i != 0) goto LAB_00179af3;
                  goto LAB_00179ae4;
                }
                uVar29 = uVar29 + 1;
                lVar25 = lVar25 + 0x30;
                pMVar26 = this;
              } while (uVar29 < (ulong)(pPVar19->super_QList<ProString>).d.size);
            }
            local_248._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_248._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_248._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            ProString::toQString
                      ((QString *)local_248,(pPVar21->super_QList<ProString>).d.ptr + uVar23);
            QVar36.m_data = (storage_type *)0xd;
            QVar36.m_size = (qsizetype)local_218;
            QString::fromUtf8(QVar36);
            local_298._0_8_ = local_218._0_8_;
            local_298._8_8_ = local_218._8_8_;
            local_298._16_8_ = local_218._16_8_;
            QRegularExpression::QRegularExpression((QRegularExpression *)&local_1c8,local_298,0);
            QVar37.m_data = (storage_type *)0x1;
            QVar37.m_size = (qsizetype)local_218;
            QString::fromUtf8(QVar37);
            local_2e8.m_string.d.d = (Data *)local_218._0_8_;
            local_2e8.m_string.d.ptr = (char16_t *)local_218._8_8_;
            local_2e8.m_string.d.size = local_218._16_8_;
            pQVar22 = (QString *)
                      QString::replace((QRegularExpression *)local_248,(QString *)&local_1c8);
            ProString::ProString((ProString *)local_218,pQVar22);
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)this_00,pQVar20[6].d.size,
                       (ProString *)local_218);
            QList<ProString>::end(this_00);
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
              }
            }
            if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1c8);
            if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
              }
            }
            this = pMVar26;
            if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              pQVar28 = (QArrayData *)local_248._0_8_;
              if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
LAB_00179ae4:
                QArrayData::deallocate(pQVar28,2,0x10);
              }
            }
LAB_00179af3:
            uVar23 = uVar23 + 1;
          } while (uVar23 < (ulong)(pPVar21->super_QList<ProString>).d.size);
        }
        local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_218._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_248._0_8_ = &local_a8;
        local_248._8_8_ = ".target";
        ProString::ProString<QString&,char_const(&)[8]>
                  ((ProString *)local_218,(QStringBuilder<QString_&,_const_char_(&)[8]> *)local_248)
        ;
        bVar13 = QMakeProject::isEmpty(pMVar26->project,(ProKey *)local_218);
        if (bVar13) {
          local_298._0_8_ = "sub-";
          local_298._8_8_ = &local_158;
          QStringBuilder<const_char_(&)[5],_QString_&>::convertTo<QString>
                    ((QString *)local_248,(QStringBuilder<const_char_(&)[5],_QString_&> *)local_298)
          ;
          pQVar28 = &(pQVar20[4].d.d)->super_QArrayData;
          pSVar30 = (SourceFiles *)pQVar20[4].d.ptr;
          pQVar20[4].d.d = (Data *)local_248._0_8_;
          pQVar20[4].d.ptr = (char16_t *)local_248._8_8_;
          pSVar3 = (SourceFiles *)pQVar20[4].d.size;
          pQVar20[4].d.size = local_248._16_8_;
          local_248._0_8_ = pQVar28;
          local_248._8_8_ = pSVar30;
          local_248._16_8_ = pSVar3;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar28,2,0x10);
            }
          }
          QVar42.m_data = (storage_type *)0xd;
          QVar42.m_size = (qsizetype)local_248;
          QString::fromUtf8(QVar42);
          local_298._0_8_ = local_248._0_8_;
          local_298._8_8_ = local_248._8_8_;
          local_298._16_8_ = local_248._16_8_;
          QRegularExpression::QRegularExpression
                    ((QRegularExpression *)&local_1c8,
                     (QStringBuilder<const_char_(&)[5],_QString_&> *)local_298,0);
          QVar43.m_data = (storage_type *)0x1;
          QVar43.m_size = (qsizetype)local_248;
          QString::fromUtf8(QVar43);
          local_2e8.m_string.d.d = (Data *)local_248._0_8_;
          local_2e8.m_string.d.ptr = (char16_t *)local_248._8_8_;
          local_2e8.m_string.d.size = local_248._16_8_;
          QString::replace((QRegularExpression *)(pQVar20 + 4),(QString *)&local_1c8);
          if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1c8);
          if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
            }
          }
        }
        else {
          QMakeEvaluator::first
                    ((ProString *)local_248,&pMVar26->project->super_QMakeEvaluator,
                     (ProKey *)local_218);
          ProString::toQString((QString *)local_298,(ProString *)local_248);
          pQVar28 = &(pQVar20[4].d.d)->super_QArrayData;
          pSVar30 = (SourceFiles *)pQVar20[4].d.ptr;
          pQVar20[4].d.d = (Data *)local_298._0_8_;
          pQVar20[4].d.ptr = (char16_t *)local_298._8_8_;
          pSVar3 = (SourceFiles *)pQVar20[4].d.size;
          pQVar20[4].d.size = local_298._16_8_;
          local_298._0_8_ = pQVar28;
          local_298._8_8_ = pSVar30;
          local_298._16_8_ = pSVar3;
          if (pQVar28 != (QArrayData *)0x0) {
            LOCK();
            (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar28,2,0x10);
            }
          }
          if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
            }
          }
        }
        if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
          }
        }
      }
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_108._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      if (local_a8 != (QArrayData *)0x0) {
        LOCK();
        (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a8,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar4 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < (ulong)(pPVar19->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<MakefileGenerator::SubTarget*>
MakefileGenerator::findSubDirsSubTargets() const
{
    QList<SubTarget*> targets;
    {
        const ProStringList &subdirs = project->values("SUBDIRS");
        for(int subdir = 0; subdir < subdirs.size(); ++subdir) {
            ProString ofile = subdirs[subdir];
            QString oname = ofile.toQString();
            QString fixedSubdir = oname;
            fixedSubdir.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");

            SubTarget *st = new SubTarget;
            st->name = oname;
            targets.append(st);

            bool fromFile = false;
            const ProKey fkey(fixedSubdir + ".file");
            const ProKey skey(fixedSubdir + ".subdir");
            if (!project->isEmpty(fkey)) {
                if (!project->isEmpty(skey))
                    warn_msg(WarnLogic, "Cannot assign both file and subdir for subdir %s",
                             subdirs[subdir].toLatin1().constData());
                ofile = project->first(fkey);
                fromFile = true;
            } else if (!project->isEmpty(skey)) {
                ofile = project->first(skey);
                fromFile = false;
            } else {
                fromFile = ofile.endsWith(Option::pro_ext);
            }
            QString file = Option::fixPathToTargetOS(ofile.toQString());

            if(fromFile) {
                int slsh = file.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    st->in_directory = file.left(slsh+1);
                    st->profile = file.mid(slsh+1);
                } else {
                    st->profile = file;
                }
            } else {
                if (!file.isEmpty() && !project->isActiveConfig("subdir_first_pro")) {
                    const QString baseName = file.section(Option::dir_sep, -1);
                    if (baseName.isEmpty()) {
                        warn_msg(WarnLogic, "Ignoring invalid SUBDIRS entry %s",
                                 subdirs[subdir].toLatin1().constData());
                        continue;
                    }
                    st->profile = baseName + Option::pro_ext;
                }
                st->in_directory = file;
            }
            while(st->in_directory.endsWith(Option::dir_sep))
                st->in_directory.chop(1);
            if(fileInfo(st->in_directory).isRelative())
                st->out_directory = st->in_directory;
            else
                st->out_directory = fileFixify(st->in_directory, FileFixifyBackwards);
            const ProKey mkey(fixedSubdir + ".makefile");
            if (!project->isEmpty(mkey)) {
                st->makefile = project->first(mkey).toQString();
            } else {
                st->makefile = "Makefile";
                if(!st->profile.isEmpty()) {
                    QString basename = st->in_directory;
                    int new_slsh = basename.lastIndexOf(Option::dir_sep);
                    if(new_slsh != -1)
                        basename = basename.mid(new_slsh+1);
                    if(st->profile != basename + Option::pro_ext)
                        st->makefile += "." + st->profile.left(st->profile.size() - Option::pro_ext.size());
                }
            }
            const ProKey dkey(fixedSubdir + ".depends");
            if (!project->isEmpty(dkey)) {
                const ProStringList &depends = project->values(dkey);
                for(int depend = 0; depend < depends.size(); ++depend) {
                    bool found = false;
                    for(int subDep = 0; subDep < subdirs.size(); ++subDep) {
                        if(subdirs[subDep] == depends.at(depend)) {
                            QString subName = subdirs[subDep].toQString();
                            QString fixedSubDep = subName;
                            fixedSubDep.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            const ProKey dtkey(fixedSubDep + ".target");
                            if (!project->isEmpty(dtkey)) {
                                st->depends += project->first(dtkey);
                            } else {
                                QString d = Option::fixPathToTargetOS(subName);
                                const ProKey dfkey(fixedSubDep + ".file");
                                if (!project->isEmpty(dfkey)) {
                                    d = project->first(dfkey).toQString();
                                } else {
                                    const ProKey dskey(fixedSubDep + ".subdir");
                                    if (!project->isEmpty(dskey))
                                        d = project->first(dskey).toQString();
                                }
                                st->depends += "sub-" + d.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            }
                            found = true;
                            break;
                        }
                    }
                    if(!found) {
                        QString depend_str = depends.at(depend).toQString();
                        st->depends += depend_str.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                    }
                }
            }
            const ProKey tkey(fixedSubdir + ".target");
            if (!project->isEmpty(tkey)) {
                st->target = project->first(tkey).toQString();
            } else {
                st->target = "sub-" + file;
                st->target.replace(QRegularExpression("[^a-zA-Z0-9_]"), "-");
            }
        }
    }
    return targets;
}